

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD2Loader.cpp
# Opt level: O2

void __thiscall Assimp::MD2Importer::ValidateHeader(MD2Importer *this)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  Logger *pLVar4;
  Header *pHVar5;
  DeadlyImportError *pDVar6;
  uint uVar7;
  ulong uVar8;
  allocator local_61;
  string local_60;
  char szBuffer [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pHVar5 = this->m_pcHeader;
  uVar1 = pHVar5->magic;
  if ((uVar1 != 0x32504449) && (uVar1 != 0x49445032)) {
    szBuffer[0] = (char)uVar1;
    szBuffer[1] = (char)(uVar1 >> 8);
    szBuffer[2] = (char)(uVar1 >> 0x10);
    szBuffer[3] = (char)(uVar1 >> 0x18);
    szBuffer[4] = '\0';
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_38,szBuffer,&local_61);
    std::operator+(&local_60,"Invalid MD2 magic word: should be IDP2, the magic word found is ",
                   &local_38);
    DeadlyImportError::DeadlyImportError(pDVar6,&local_60);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pHVar5->version != 8) {
    pLVar4 = DefaultLogger::get();
    Logger::warn(pLVar4,"Unsupported md2 file version. Continuing happily ...");
    pHVar5 = this->m_pcHeader;
  }
  uVar7 = pHVar5->numFrames;
  if (uVar7 == 0) {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_60,"Invalid md2 file: NUM_FRAMES is 0",(allocator *)&local_38);
    DeadlyImportError::DeadlyImportError(pDVar6,&local_60);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = this->fileSize;
  uVar8 = (ulong)uVar2;
  if (uVar2 < pHVar5->offsetEnd) {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_60,"Invalid md2 file: File is too small",(allocator *)&local_38);
    DeadlyImportError::DeadlyImportError(pDVar6,&local_60);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = pHVar5->numSkins;
  if (0x400000 < (ulong)uVar3) {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_60,"Invalid MD2 header: too many skins, would overflow",
               (allocator *)&local_38);
    DeadlyImportError::DeadlyImportError(pDVar6,&local_60);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0x4000000 < pHVar5->numVertices) {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_60,"Invalid MD2 header: too many vertices, would overflow",
               (allocator *)&local_38);
    DeadlyImportError::DeadlyImportError(pDVar6,&local_60);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ulong)pHVar5->numTexCoords < 0x4000001) {
    if (0x1555555 < (ulong)pHVar5->numTriangles) {
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_60,"Invalid MD2 header: too many triangles, would overflow",
                 (allocator *)&local_38);
      DeadlyImportError::DeadlyImportError(pDVar6,&local_60);
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (uVar7 < 0x5d1746) {
      if (((ulong)uVar3 * 0x40 + (ulong)pHVar5->offsetSkins < uVar8) &&
         ((ulong)pHVar5->offsetTexCoords + (ulong)pHVar5->numTexCoords * 4 < uVar8)) {
        if (((ulong)pHVar5->numTriangles * 0xc + (ulong)pHVar5->offsetTriangles < uVar8) &&
           ((pHVar5->numVertices * 4 + 0x28) * uVar7 + pHVar5->offsetFrames < uVar2)) {
          if (0x20 < uVar3) {
            pLVar4 = DefaultLogger::get();
            Logger::warn(pLVar4,"The model contains more skins than Quake 2 supports");
            pHVar5 = this->m_pcHeader;
            uVar7 = pHVar5->numFrames;
          }
          if (0x200 < uVar7) {
            pLVar4 = DefaultLogger::get();
            Logger::warn(pLVar4,"The model contains more frames than Quake 2 supports");
            pHVar5 = this->m_pcHeader;
          }
          if (0x800 < pHVar5->numVertices) {
            pLVar4 = DefaultLogger::get();
            Logger::warn(pLVar4,"The model contains more vertices than Quake 2 supports");
            pHVar5 = this->m_pcHeader;
          }
          if (this->configFrameID < pHVar5->numFrames) {
            return;
          }
          pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&local_60,"The requested frame is not existing the file",
                     (allocator *)&local_38);
          DeadlyImportError::DeadlyImportError(pDVar6,&local_60);
          __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_60,"Invalid MD2 header: some offsets are outside the file",
                 (allocator *)&local_38);
      DeadlyImportError::DeadlyImportError(pDVar6,&local_60);
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_60,"Invalid MD2 header: too many frames, would overflow",
               (allocator *)&local_38);
    DeadlyImportError::DeadlyImportError(pDVar6,&local_60);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_60,"Invalid MD2 header: too many texcoords, would overflow",
             (allocator *)&local_38);
  DeadlyImportError::DeadlyImportError(pDVar6,&local_60);
  __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MD2Importer::ValidateHeader( )
{
    // check magic number
    if (m_pcHeader->magic != AI_MD2_MAGIC_NUMBER_BE &&
        m_pcHeader->magic != AI_MD2_MAGIC_NUMBER_LE)
    {
        char szBuffer[5];
        szBuffer[0] = ((char*)&m_pcHeader->magic)[0];
        szBuffer[1] = ((char*)&m_pcHeader->magic)[1];
        szBuffer[2] = ((char*)&m_pcHeader->magic)[2];
        szBuffer[3] = ((char*)&m_pcHeader->magic)[3];
        szBuffer[4] = '\0';

        throw DeadlyImportError("Invalid MD2 magic word: should be IDP2, the "
            "magic word found is " + std::string(szBuffer));
    }

    // check file format version
    if (m_pcHeader->version != 8)
        ASSIMP_LOG_WARN( "Unsupported md2 file version. Continuing happily ...");

    // check some values whether they are valid
    if (0 == m_pcHeader->numFrames)
        throw DeadlyImportError( "Invalid md2 file: NUM_FRAMES is 0");

    if (m_pcHeader->offsetEnd > (uint32_t)fileSize)
        throw DeadlyImportError( "Invalid md2 file: File is too small");

    if (m_pcHeader->numSkins > AI_MAX_ALLOC(MD2::Skin)) {
        throw DeadlyImportError("Invalid MD2 header: too many skins, would overflow");
    }

    if (m_pcHeader->numVertices > AI_MAX_ALLOC(MD2::Vertex)) {
        throw DeadlyImportError("Invalid MD2 header: too many vertices, would overflow");
    }

    if (m_pcHeader->numTexCoords > AI_MAX_ALLOC(MD2::TexCoord)) {
        throw DeadlyImportError("Invalid MD2 header: too many texcoords, would overflow");
    }

    if (m_pcHeader->numTriangles > AI_MAX_ALLOC(MD2::Triangle)) {
        throw DeadlyImportError("Invalid MD2 header: too many triangles, would overflow");
    }

    if (m_pcHeader->numFrames > AI_MAX_ALLOC(MD2::Frame)) {
        throw DeadlyImportError("Invalid MD2 header: too many frames, would overflow");
    }

    // -1 because Frame already contains one
    unsigned int frameSize = sizeof (MD2::Frame) + (m_pcHeader->numVertices - 1) * sizeof(MD2::Vertex);

    if (m_pcHeader->offsetSkins     + m_pcHeader->numSkins * sizeof (MD2::Skin)         >= fileSize ||
        m_pcHeader->offsetTexCoords + m_pcHeader->numTexCoords * sizeof (MD2::TexCoord) >= fileSize ||
        m_pcHeader->offsetTriangles + m_pcHeader->numTriangles * sizeof (MD2::Triangle) >= fileSize ||
        m_pcHeader->offsetFrames    + m_pcHeader->numFrames * frameSize                 >= fileSize ||
        m_pcHeader->offsetEnd           > fileSize)
    {
        throw DeadlyImportError("Invalid MD2 header: some offsets are outside the file");
    }

    if (m_pcHeader->numSkins > AI_MD2_MAX_SKINS)
        ASSIMP_LOG_WARN("The model contains more skins than Quake 2 supports");
    if ( m_pcHeader->numFrames > AI_MD2_MAX_FRAMES)
        ASSIMP_LOG_WARN("The model contains more frames than Quake 2 supports");
    if (m_pcHeader->numVertices > AI_MD2_MAX_VERTS)
        ASSIMP_LOG_WARN("The model contains more vertices than Quake 2 supports");

    if (m_pcHeader->numFrames <= configFrameID )
        throw DeadlyImportError("The requested frame is not existing the file");
}